

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-server.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  void *__s;
  int *piVar4;
  ushort uVar5;
  value_type *__val;
  Communicator server1;
  Communicator server0;
  Communicator local_50 [8];
  Communicator local_48 [8];
  timespec local_40;
  
  printf("Usage: %s port\n");
  if (argc < 2) {
    return -1;
  }
  iVar2 = atoi(argv[1]);
  GGSock::Communicator::Communicator(local_48,false);
  GGSock::Communicator::Communicator(local_50,false);
  __s = operator_new(0x20000);
  memset(__s,0,0x20000);
  do {
    GGSock::Communicator::listen((int)local_48,iVar2,0);
    GGSock::Communicator::listen((int)local_50,iVar2,0);
    cVar1 = GGSock::Communicator::isConnected();
    if (cVar1 != '\0') {
      puts("sending client 1");
      uVar5 = (ushort)local_48;
      GGSock::Communicator::send(uVar5);
      GGSock::Communicator::send(uVar5,(char *)0x5e,(uint)__s);
    }
    cVar1 = GGSock::Communicator::isConnected();
    if (cVar1 != '\0') {
      puts("sending client 2");
      uVar5 = (ushort)local_50;
      GGSock::Communicator::send(uVar5);
      GGSock::Communicator::send(uVar5,(char *)0x5e,(uint)__s);
    }
    GGSock::Communicator::update();
    GGSock::Communicator::update();
    local_40.tv_sec = 0;
    local_40.tv_nsec = 100000000;
    do {
      iVar3 = nanosleep(&local_40,&local_40);
      if (iVar3 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s port\n", argv[0]);
    if (argc < 2) {
        return -1;
    }

    int port = atoi(argv[1]);

    GGSock::Communicator server0(false);
    GGSock::Communicator server1(false);

    std::vector<char> data(128*1024);

    while (true) {
        server0.listen(port, 0);
        server1.listen(port, 0);

        if (server0.isConnected()) {
            printf("sending client 1\n");
            server0.send(95);
            server0.send(94, data.data(), data.size());
        }

        if (server1.isConnected()) {
            printf("sending client 2\n");
            server1.send(95);
            server1.send(94, data.data(), data.size());
        }

        server0.update();
        server1.update();

		std::this_thread::sleep_for(std::chrono::milliseconds(100));
	}

    return 0;
}